

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

int __thiscall soplex::SPxSteepPR<double>::selectLeaveX(SPxSteepPR<double> *this,double tol)

{
  double dVar1;
  double dVar2;
  SPxSolverBase<double> *pSVar3;
  pointer pdVar4;
  pointer pdVar5;
  double *pdVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  double dVar10;
  double dVar11;
  
  pSVar3 = (this->super_SPxPricer<double>).thesolver;
  pdVar4 = (pSVar3->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pSVar3->coWeights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar6 = (double *)infinity();
  uVar7 = (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum;
  iVar9 = -1;
  uVar8 = uVar7;
  dVar10 = -*pdVar6;
  do {
    while( true ) {
      uVar7 = uVar7 - 1;
      if ((int)uVar8 < 1) {
        return iVar9;
      }
      dVar1 = pdVar4[uVar7];
      if (dVar1 < -tol) break;
LAB_00200cf0:
      uVar8 = uVar8 - 1;
    }
    dVar2 = pdVar5[uVar7];
    dVar11 = tol;
    if (tol <= dVar2) {
      dVar11 = dVar2;
    }
    dVar11 = (dVar1 * dVar1) / dVar11;
    if (dVar11 <= dVar10) goto LAB_00200cf0;
    iVar9 = uVar8 - 1;
    uVar8 = uVar7;
    dVar10 = dVar11;
  } while( true );
}

Assistant:

int SPxSteepPR<R>::selectLeaveX(R tol)
{
   const R* coWeights_ptr = this->thesolver->coWeights.get_const_ptr();
   const R* fTest         = this->thesolver->fTest().get_const_ptr();
   R best = R(-infinity);
   R x;
   int lastIdx = -1;

   for(int i = this->thesolver->dim() - 1; i >= 0; --i)
   {
      x = fTest[i];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, coWeights_ptr[i], tol);

         if(x > best)
         {
            best = x;
            lastIdx = i;
         }
      }
   }

   return lastIdx;
}